

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

void __thiscall QFontComboBoxPrivate::updateModel(QFontComboBoxPrivate *this)

{
  QFont *this_00;
  undefined4 uVar1;
  QFontComboBox *this_01;
  Data *pDVar2;
  char cVar3;
  bool bVar4;
  QAbstractItemModel *object;
  QStringListModel *o;
  QAbstractItemView *this_02;
  QObject *object_00;
  QString *family;
  QString *args;
  uint uVar5;
  long lVar6;
  long in_FS_OFFSET;
  int local_12c;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QFontInfo fi;
  QArrayDataPointer<QString> local_c8;
  QArrayDataPointer<QString> local_a8;
  QStringBuilder<QString,_QLatin1String> local_88;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QFontComboBox **)&(this->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  cVar3 = QCoreApplication::closingDown();
  if (cVar3 == '\0') {
    object = QComboBox::model(&this_01->super_QComboBox);
    o = QtPrivate::qobject_cast_helper<QStringListModel*,QObject>((QObject *)object);
    if (o != (QStringListModel *)0x0) {
      this_02 = (QAbstractItemView *)QComboBox::view(&this_01->super_QComboBox);
      object_00 = &QAbstractItemView::itemDelegate(this_02)->super_QObject;
      QtPrivate::qobject_cast_helper<QFontFamilyDelegate*,QObject>(object_00);
      local_12c = 0;
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QFontDatabase::families((WritingSystem)&local_a8);
      local_c8.size = 0;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (QString *)0x0;
      _fi = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = &this->currentFont;
      QFontInfo::QFontInfo(&fi,this_00);
      args = local_a8.ptr;
      for (lVar6 = local_a8.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
        cVar3 = QFontDatabase::isPrivateFamily((QString *)args);
        if (cVar3 == '\0') {
          uVar5 = (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                  super_QFlagsStorage<QFontComboBox::FontFilter>.i;
          if (((uVar5 & 3) != 0) && ((uVar5 & 3) != 3)) {
            local_88.a.d.d = (Data *)0x0;
            local_88.a.d.ptr = (char16_t *)0x0;
            local_88.a.d.size = 0;
            cVar3 = QFontDatabase::isSmoothlyScalable((QString *)args,(QString *)&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_88);
            if (((uVar5 & 1) == 0) == (bool)cVar3) goto LAB_003dbabd;
            uVar5 = (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                    super_QFlagsStorage<QFontComboBox::FontFilter>.i;
          }
          if (((uVar5 & 0xc) != 0) && ((uVar5 & 0xc) != 0xc)) {
            local_88.a.d.d = (Data *)0x0;
            local_88.a.d.ptr = (char16_t *)0x0;
            local_88.a.d.size = 0;
            cVar3 = QFontDatabase::isFixedPitch((QString *)args,(QString *)&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_88);
            if (((uVar5 & 4) == 0) == (bool)cVar3) goto LAB_003dbabd;
          }
          QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_c8,args);
          QFontInfo::family();
          bVar4 = ::comparesEqual(args,(QString *)&local_58);
          if (bVar4) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          }
          else {
            QFontInfo::family();
            local_88.a.d.size = local_108.size;
            local_88.a.d.ptr = local_108.ptr;
            local_88.a.d.d = local_108.d;
            local_108.d = (Data *)0x0;
            local_108.ptr = (char16_t *)0x0;
            local_108.size = 0;
            local_88.b.m_size = 2;
            local_88.b.m_data = " [";
            QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                      ((QString *)&local_e8,&local_88);
            cVar3 = QString::startsWith((QString *)args,(CaseSensitivity)&local_e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            if (cVar3 == '\0') goto LAB_003dbabd;
          }
          local_12c = (int)local_c8.size + -1;
        }
LAB_003dbabd:
        args = args + 1;
      }
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSignalBlocker::QSignalBlocker((QSignalBlocker *)&local_58,(QObject *)o);
      QStringListModel::setStringList((QList_conflict *)o);
      cVar3 = QAccessible::isActive();
      if (cVar3 != '\0') {
        local_88.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.a.d.size = (qsizetype)QComboBox::view(&this_01->super_QComboBox);
        local_88.b.m_size = 0xffffffff;
        local_88.a.d.d = (Data *)QIcon::QIcon;
        local_88.b.m_data = (char *)0xffffffffffffffff;
        uStack_60 = 0xffffffff;
        uStack_5c = 0xffffffff;
        local_88.a.d.ptr = (char16_t *)CONCAT44(local_88.a.d.ptr._4_4_,0x116);
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_88);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)&local_88);
      }
      QSignalBlocker::~QSignalBlocker((QSignalBlocker *)&local_58);
      if (local_c8.size == 0) {
        QFont::QFont((QFont *)&local_88);
        cVar3 = QFont::operator!=(this_00,(QFont *)&local_88);
        QFont::~QFont((QFont *)&local_88);
        if (cVar3 != '\0') {
          QFont::QFont((QFont *)&local_88);
          pDVar2 = *(Data **)&this->currentFont;
          *(Data **)&this->currentFont = local_88.a.d.d;
          uVar1 = *(undefined4 *)&this->field_0x360;
          *(undefined4 *)&this->field_0x360 = local_88.a.d.ptr._0_4_;
          local_88.a.d.ptr = (char16_t *)CONCAT44(local_88.a.d.ptr._4_4_,uVar1);
          local_88.a.d.d = pDVar2;
          QFont::~QFont((QFont *)&local_88);
          QFontComboBox::currentFontChanged(this_01,this_00);
        }
      }
      else {
        QComboBox::setCurrentIndex(&this_01->super_QComboBox,local_12c);
      }
      QFontInfo::~QFontInfo(&fi);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBoxPrivate::updateModel()
{
    Q_Q(QFontComboBox);

    if (QCoreApplication::closingDown())
        return;

    const int scalableMask = (QFontComboBox::ScalableFonts | QFontComboBox::NonScalableFonts);
    const int spacingMask = (QFontComboBox::ProportionalFonts | QFontComboBox::MonospacedFonts);

    QStringListModel *m = qobject_cast<QStringListModel *>(q->model());
    if (!m)
        return;
    QFontFamilyDelegate *delegate = qobject_cast<QFontFamilyDelegate *>(q->view()->itemDelegate());
    QFontDatabase::WritingSystem system = delegate ? delegate->writingSystem : QFontDatabase::Any;

    const QStringList list = QFontDatabase::families(system);
    QStringList result;

    int offset = 0;
    QFontInfo fi(currentFont);

    for (const auto &family : list) {
        if (QFontDatabase::isPrivateFamily(family))
            continue;

        if ((filters & scalableMask) && (filters & scalableMask) != scalableMask) {
            if (bool(filters & QFontComboBox::ScalableFonts) != QFontDatabase::isSmoothlyScalable(family))
                continue;
        }
        if ((filters & spacingMask) && (filters & spacingMask) != spacingMask) {
            if (bool(filters & QFontComboBox::MonospacedFonts) != QFontDatabase::isFixedPitch(family))
                continue;
        }
        result += family;
        if (family == fi.family() || family.startsWith(fi.family() + " ["_L1))
            offset = result.size() - 1;
    }

    //we need to block the signals so that the model doesn't emit reset
    //this prevents the current index from changing
    //it will be updated just after this
    ///TODO: we should finda way to avoid blocking signals and have a real update of the model
    {
        const QSignalBlocker blocker(m);
        m->setStringList(result);
        // Since the modelReset signal is blocked the view will not emit an accessibility event
    #if QT_CONFIG(accessibility)
        if (QAccessible::isActive()) {
            QAccessibleTableModelChangeEvent accessibleEvent(q->view(), QAccessibleTableModelChangeEvent::ModelReset);
            QAccessible::updateAccessibility(&accessibleEvent);
        }
    #endif
    }

    if (result.isEmpty()) {
        if (currentFont != QFont()) {
            currentFont = QFont();
            emit q->currentFontChanged(currentFont);
        }
    } else {
        q->setCurrentIndex(offset);
    }
}